

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
* __thiscall
pbrt::
Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
::operator=(Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
            *this,Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                  *other)

{
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_> *pvVar1
  ;
  memory_resource *pmVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  uint uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Bounds2<int> tmp;
  
  if ((this->allocator).memoryResource == (other->allocator).memoryResource) {
    TVar3 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    TVar4 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    TVar5 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
         (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar5;
    (other->extent).pMin.super_Tuple2<pbrt::Point2,_int> = TVar3;
    (other->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar4;
    pvVar1 = this->values;
    this->values = other->values;
    other->values = pvVar1;
  }
  else {
    bVar6 = Bounds2<int>::operator==(&this->extent,&other->extent);
    uVar8 = ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
            (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y) *
            ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
            (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x);
    if (bVar6) {
      for (lVar9 = 0; (ulong)(~((int)uVar8 >> 0x1f) & uVar8) * 0x18 - lVar9 != 0;
          lVar9 = lVar9 + 0x18) {
        std::
        _Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
        ::~_Vector_base((_Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                         *)((long)&(this->values->
                                   super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar9));
        std::
        vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
        vector((vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                *)((long)&(this->values->
                          super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar9),
               (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                *)((long)&(other->values->
                          super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar9));
      }
      TVar3 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
           (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar3;
    }
    else {
      for (lVar9 = 0; (ulong)(~((int)uVar8 >> 0x1f) & uVar8) * 0x18 - lVar9 != 0;
          lVar9 = lVar9 + 0x18) {
        std::
        _Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
        ::~_Vector_base((_Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                         *)((long)&(this->values->
                                   super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar9));
      }
      pmVar2 = (this->allocator).memoryResource;
      (*pmVar2->_vptr_memory_resource[3])(pmVar2,this->values,(long)(int)uVar8 * 0x18,8);
      pmVar2 = (this->allocator).memoryResource;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      auVar11 = vpsubd_avx(auVar10,auVar11);
      auVar10 = vpshufd_avx(auVar11,0x55);
      auVar10 = vpmulld_avx(auVar10,auVar11);
      uVar8 = auVar10._0_4_;
      iVar7 = (*pmVar2->_vptr_memory_resource[2])(pmVar2,(long)(int)uVar8 * 0x18,8);
      this->values = (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                      *)CONCAT44(extraout_var,iVar7);
      for (lVar9 = 0; (ulong)(~((int)uVar8 >> 0x1f) & uVar8) * 0x18 - lVar9 != 0;
          lVar9 = lVar9 + 0x18) {
        std::
        vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
        vector((vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                *)((long)&(this->values->
                          super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar9),
               (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                *)((long)&(other->values->
                          super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar9));
      }
    }
  }
  return this;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }